

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::cylinderMesh(Mesh *__return_storage_ptr__,float _radius,float _height,
                         int _radiusSegments,int _heightSegments,int _numCapSegments,bool _bCapped,
                         DrawMode _drawMode)

{
  float fVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  int iVar3;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aVar4;
  float fVar5;
  double dVar6;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar7 [16];
  vec<3,_float,_(glm::qualifier)0> vVar8;
  int local_168;
  int local_164;
  int x_5;
  int y_5;
  int x_4;
  int y_4;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  int local_13c;
  int local_138;
  int ix_2;
  int iy_2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_12c;
  int local_128;
  int local_124;
  int x_3;
  int y_3;
  int x_2;
  int y_2;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_110;
  float local_108;
  vec<3,_float,_(glm::qualifier)0> local_104;
  float local_f8;
  float local_f4;
  float local_f0;
  int local_ec;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_e8;
  int ix_1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e0;
  int local_dc;
  float local_d8;
  int iy_1;
  float minTexYNormalized;
  int x_1;
  int y_1;
  int x;
  int y;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  int local_a4;
  int local_a0;
  int ix;
  int iy;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_94;
  float local_90;
  float local_8c;
  float maxTexYNormalized;
  float maxTexY;
  size_t vertOffset;
  vec3 up;
  vec3 normal;
  vec2 tcoord;
  vec3 vert;
  float newRad;
  float halfH;
  float heightInc;
  float angleIncRadius;
  int capSegs;
  DrawMode local_2c;
  byte local_25;
  DrawMode _drawMode_local;
  int iStack_20;
  bool _bCapped_local;
  int _numCapSegments_local;
  int _heightSegments_local;
  int _radiusSegments_local;
  float _height_local;
  float _radius_local;
  Mesh *mesh;
  
  _radiusSegments_local = (int)_radius;
  __height_local = __return_storage_ptr__;
  Mesh::Mesh(__return_storage_ptr__);
  local_2c = _drawMode;
  if ((_drawMode != TRIANGLE_STRIP) && (_drawMode != TRIANGLES)) {
    local_2c = TRIANGLE_STRIP;
  }
  Mesh::setDrawMode(__return_storage_ptr__,local_2c);
  iVar3 = _radiusSegments + 1;
  heightInc = (float)(_numCapSegments + 1);
  iStack_20 = _heightSegments + 1;
  if (iStack_20 < 2) {
    iStack_20 = 2;
  }
  local_25 = _bCapped;
  if ((int)heightInc < 2) {
    local_25 = 0;
  }
  if ((local_25 & 1) == 0) {
    heightInc = 1.4013e-45;
  }
  fVar1 = -6.2831855 / ((float)iVar3 - 1.0);
  aVar4.y = _height * 0.5;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)((long)&vertOffset + 4),0,1,0);
  _maxTexYNormalized = 0;
  local_8c = (float)iStack_20 - 1.0;
  if (0 < (int)heightInc) {
    local_8c = ((float)((int)heightInc << 1) - 2.0) + local_8c;
  }
  local_90 = ((float)(int)heightInc - 1.0) / local_8c;
  if (((local_25 & 1) != 0) && (0 < (int)heightInc)) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec((vec<3,_float,_(glm::qualifier)0> *)&ix,0.0,-1.0,0.0)
    ;
    up.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)ix;
    up.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)iy;
    normal.field_0 = local_94;
    for (local_a0 = 0; local_a0 < (int)heightInc; local_a0 = local_a0 + 1) {
      for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
        local_a8 = (float)local_a0;
        local_ac = 0.0;
        local_b0 = (float)((int)heightInc + -1);
        local_b4 = 0.0;
        fVar5 = remap(&local_a8,&local_ac,&local_b0,&local_b4,(float *)&_radiusSegments_local,true);
        dVar6 = std::cos((double)(ulong)(uint)((float)local_a4 * fVar1));
        tcoord.field_0.x = SUB84(dVar6,0) * fVar5;
        std::sin((double)(ulong)(uint)((float)local_a4 * fVar1));
        tcoord.field_1.y = -aVar4.y;
        normal.field_1.y = (float)local_a4 / ((float)iVar3 + -1.0);
        local_b8 = (float)local_a0;
        local_bc = 0.0;
        y = (int)(float)((int)heightInc + -1);
        x = 0;
        fVar5 = remap(&local_b8,&local_bc,(float *)&y,(float *)&x,&local_90,true);
        normal.field_2.z = 1.0 - fVar5;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&normal.field_1);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&tcoord);
        Mesh::addNormal(__return_storage_ptr__,(vec3 *)&up.field_1);
      }
    }
    if (local_2c == TRIANGLES) {
      for (y_1 = 0; y_1 < (int)heightInc + -1; y_1 = y_1 + 1) {
        for (x_1 = 0; x_1 < _radiusSegments; x_1 = x_1 + 1) {
          if (0 < y_1) {
            Mesh::addIndex(__return_storage_ptr__,y_1 * iVar3 + x_1 + (int)maxTexYNormalized);
            Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_1 * iVar3 + x_1);
            Mesh::addIndex(__return_storage_ptr__,(y_1 + 1) * iVar3 + x_1 + (int)maxTexYNormalized);
          }
          Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_1 * iVar3 + x_1);
          Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + (y_1 + 1) * iVar3 + x_1
                        );
          Mesh::addIndex(__return_storage_ptr__,(y_1 + 1) * iVar3 + x_1 + (int)maxTexYNormalized);
        }
      }
    }
    else {
      for (minTexYNormalized = 0.0; (int)minTexYNormalized < (int)heightInc + -1;
          minTexYNormalized = (float)((int)minTexYNormalized + 1)) {
        for (iy_1 = 0; iy_1 < iVar3; iy_1 = iy_1 + 1) {
          Mesh::addIndex(__return_storage_ptr__,
                         (int)minTexYNormalized * iVar3 + iy_1 + (int)maxTexYNormalized);
          Mesh::addIndex(__return_storage_ptr__,
                         ((int)minTexYNormalized + 1) * iVar3 + iy_1 + (int)maxTexYNormalized);
        }
      }
    }
    _maxTexYNormalized = Mesh::getVerticesTotal(__return_storage_ptr__);
  }
  vVar2.field_2.z = normal.field_0.x;
  vVar2.field_0.x = up.field_1.y;
  vVar2.field_1.y = up.field_2.z;
  vVar8.field_2 = local_110;
  vVar8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)x_2;
  vVar8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)y_2;
  local_d8 = 0.0;
  if ((local_25 & 1) != 0) {
    local_d8 = local_90;
  }
  local_90 = 1.0;
  if ((local_25 & 1) != 0) {
    local_90 = (float)iStack_20 / local_8c;
  }
  local_dc = 0;
  while( true ) {
    normal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2;
    up._4_8_ = vVar2._0_8_;
    if (iStack_20 <= local_dc) break;
    _x_2 = vVar8;
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)&stack0xffffffffffffff18,1.0,0.0,0.0);
    vVar2.field_2 = local_e0;
    vVar2.field_0 = aStack_e8;
    vVar2.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)ix_1;
    local_ec = 0;
    auVar7 = extraout_XMM0;
    vVar8 = _x_2;
    while( true ) {
      normal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2
      ;
      up._4_8_ = vVar2._0_8_;
      if (iVar3 <= local_ec) break;
      auVar7._0_4_ = (float)local_ec * fVar1;
      _x_2 = vVar8;
      dVar6 = std::cos(auVar7._0_8_);
      tcoord.field_0.x = SUB84(dVar6,0) * (float)_radiusSegments_local;
      tcoord.field_1.y = (_height / ((float)iStack_20 - 1.0)) * (float)local_dc - aVar4.y;
      std::sin((double)(ulong)(uint)((float)local_ec * fVar1));
      normal.field_1.y = (float)local_ec / ((float)iVar3 + -1.0);
      local_f0 = (float)local_dc;
      local_f4 = 0.0;
      local_f8 = (float)(iStack_20 + -1);
      fVar5 = remap(&local_f0,&local_f4,&local_f8,&local_d8,&local_90,true);
      normal.field_2.z = 1.0 - fVar5;
      Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&normal.field_1);
      Mesh::addVertex(__return_storage_ptr__,(vec3 *)&tcoord);
      Mesh::addNormal(__return_storage_ptr__,(vec3 *)&up.field_1);
      local_108 = -fVar1;
      vVar8 = glm::rotate<float,(glm::qualifier)0>
                        ((vec<3,_float,_(glm::qualifier)0> *)&up.field_1,&local_108,
                         (vec<3,_float,_(glm::qualifier)0> *)((long)&vertOffset + 4));
      auVar7 = ZEXT416(0);
      local_ec = local_ec + 1;
      local_104 = vVar8;
      vVar2 = vVar8;
    }
    local_dc = local_dc + 1;
  }
  if (local_2c == TRIANGLES) {
    for (y_3 = 0; y_3 < iStack_20 + -1; y_3 = y_3 + 1) {
      x_3 = 0;
      while( true ) {
        normal.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2;
        up._4_8_ = vVar2._0_8_;
        if (_radiusSegments <= x_3) break;
        _x_2 = vVar8;
        Mesh::addIndex(__return_storage_ptr__,y_3 * iVar3 + x_3 + (int)maxTexYNormalized);
        Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_3 * iVar3 + x_3);
        Mesh::addIndex(__return_storage_ptr__,(y_3 + 1) * iVar3 + x_3 + (int)maxTexYNormalized);
        Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_3 * iVar3 + x_3);
        Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + (y_3 + 1) * iVar3 + x_3);
        Mesh::addIndex(__return_storage_ptr__,(y_3 + 1) * iVar3 + x_3 + (int)maxTexYNormalized);
        vVar2.field_2.z = normal.field_0.x;
        vVar2.field_0.x = up.field_1.y;
        vVar2.field_1.y = up.field_2.z;
        x_3 = x_3 + 1;
        vVar8 = _x_2;
      }
    }
  }
  else {
    for (local_124 = 0; local_124 < iStack_20 + -1; local_124 = local_124 + 1) {
      local_128 = 0;
      while( true ) {
        normal.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2;
        up._4_8_ = vVar2._0_8_;
        if (iVar3 <= local_128) break;
        _x_2 = vVar8;
        Mesh::addIndex(__return_storage_ptr__,local_124 * iVar3 + local_128 + (int)maxTexYNormalized
                      );
        Mesh::addIndex(__return_storage_ptr__,
                       (local_124 + 1) * iVar3 + local_128 + (int)maxTexYNormalized);
        vVar2.field_2.z = normal.field_0.x;
        vVar2.field_0.x = up.field_1.y;
        vVar2.field_1.y = up.field_2.z;
        local_128 = local_128 + 1;
        vVar8 = _x_2;
      }
    }
  }
  normal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar2.field_2;
  up._4_8_ = vVar2._0_8_;
  _x_2 = vVar8;
  _maxTexYNormalized = Mesh::getVerticesTotal(__return_storage_ptr__);
  if (((local_25 & 1) != 0) && (0 < (int)heightInc)) {
    local_d8 = local_90;
    local_90 = 1.0;
    glm::vec<3,_float,_(glm::qualifier)0>::vec
              ((vec<3,_float,_(glm::qualifier)0> *)&ix_2,0.0,1.0,0.0);
    up.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)ix_2;
    up.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)iy_2;
    normal.field_0 = local_12c;
    for (local_138 = 0; local_138 < (int)heightInc; local_138 = local_138 + 1) {
      for (local_13c = 0; local_13c < iVar3; local_13c = local_13c + 1) {
        local_140 = (float)local_138;
        local_144 = 0.0;
        local_148 = (float)((int)heightInc + -1);
        local_14c = 0.0;
        fVar5 = remap(&local_140,&local_144,&local_148,(float *)&_radiusSegments_local,&local_14c,
                      true);
        dVar6 = std::cos((double)(ulong)(uint)((float)local_13c * fVar1));
        tcoord.field_0.x = SUB84(dVar6,0) * fVar5;
        std::sin((double)(ulong)(uint)((float)local_13c * fVar1));
        normal.field_1.y = (float)local_13c / ((float)iVar3 + -1.0);
        local_150 = (float)local_138;
        y_4 = 0;
        x_4 = (int)(float)((int)heightInc + -1);
        tcoord.field_1.y = aVar4.y;
        fVar5 = remap(&local_150,(float *)&y_4,(float *)&x_4,&local_d8,&local_90,true);
        normal.field_2.z = 1.0 - fVar5;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&normal.field_1);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&tcoord);
        Mesh::addNormal(__return_storage_ptr__,(vec3 *)&up.field_1);
      }
    }
    if (local_2c == TRIANGLES) {
      for (y_5 = 0; y_5 < (int)heightInc + -1; y_5 = y_5 + 1) {
        for (x_5 = 0; x_5 < _radiusSegments; x_5 = x_5 + 1) {
          Mesh::addIndex(__return_storage_ptr__,y_5 * iVar3 + x_5 + (int)maxTexYNormalized);
          Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_5 * iVar3 + x_5);
          Mesh::addIndex(__return_storage_ptr__,(y_5 + 1) * iVar3 + x_5 + (int)maxTexYNormalized);
          if ((y_5 < (int)heightInc + -1) && (2 < (int)heightInc)) {
            Mesh::addIndex(__return_storage_ptr__,(int)maxTexYNormalized + 1 + y_5 * iVar3 + x_5);
            Mesh::addIndex(__return_storage_ptr__,
                           (int)maxTexYNormalized + 1 + (y_5 + 1) * iVar3 + x_5);
            Mesh::addIndex(__return_storage_ptr__,(y_5 + 1) * iVar3 + x_5 + (int)maxTexYNormalized);
          }
        }
      }
    }
    else {
      for (local_164 = 0; local_164 < (int)heightInc + -1; local_164 = local_164 + 1) {
        for (local_168 = 0; local_168 < iVar3; local_168 = local_168 + 1) {
          Mesh::addIndex(__return_storage_ptr__,
                         local_164 * iVar3 + local_168 + (int)maxTexYNormalized);
          Mesh::addIndex(__return_storage_ptr__,
                         (local_164 + 1) * iVar3 + local_168 + (int)maxTexYNormalized);
        }
      }
    }
    _maxTexYNormalized = Mesh::getVerticesTotal(__return_storage_ptr__);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh cylinderMesh( float _radius, float _height, int _radiusSegments, int _heightSegments, int _numCapSegments, bool _bCapped, DrawMode _drawMode ) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;
        
    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    int capSegs = _numCapSegments;
    capSegs = capSegs+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    if ( capSegs < 2 ) _bCapped = false;
    if (!_bCapped) capSegs=1;

    float angleIncRadius = -1 * (TAU/((float)_radiusSegments-1.f));
    float heightInc = _height/((float)_heightSegments-1.f);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec2 tcoord;
    glm::vec3 normal;
    glm::vec3 up(0,1,0);

    std::size_t vertOffset = 0;

    float maxTexY   = _heightSegments-1.f;
    if (capSegs > 0)
        maxTexY += (capSegs*2)-2.f;
        
    float maxTexYNormalized = (capSegs-1.f) / maxTexY;

    // add the top cap //
    if (_bCapped && capSegs > 0) {
        normal = {0.f, -1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, 0.0, _radius, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = -halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, 0, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    if (y > 0) {
                        // first triangle //
                        mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }

                    // second triangle //
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();

    }

    //maxTexY            = _heightSegments-1.f + capSegs-1.f;
    float minTexYNormalized = 0;
    if (_bCapped) minTexYNormalized = maxTexYNormalized;
    maxTexYNormalized   = 1.f;
    if (_bCapped) maxTexYNormalized = (_heightSegments) / maxTexY;

    // cylinder vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        normal = {1.f, 0.f, 0.f};
        for (int ix = 0; ix < _radiusSegments; ix++) {

            //newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius);
            vert.x = cos(ix*angleIncRadius) * _radius;
            vert.y = heightInc*float(iy) - halfH;
            vert.z = sin(ix*angleIncRadius) * _radius;

            tcoord.x = float(ix)/(float(_radiusSegments)-1.f);
            tcoord.y = 1.f - remap(iy, 0, _heightSegments-1, minTexYNormalized, maxTexYNormalized, true );

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );

            normal = glm::rotate(normal, -angleIncRadius, up);

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                // first triangle //
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset);
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    } else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // add the bottom cap
    if (_bCapped && capSegs > 0) {
        minTexYNormalized = maxTexYNormalized;
        maxTexYNormalized   = 1.f;

        normal = {0.f, 1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, _radius, 0.0, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, minTexYNormalized, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs -1 && capSegs > 2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();
    }
    
    mesh.computeTangents();

    return mesh;
}